

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void init::SetLoggingOptions(ArgsManager *args)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  Logger *pLVar4;
  Logger *pLVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce7;
  path *in_stack_fffffffffffffce8;
  string *in_stack_fffffffffffffcf8;
  undefined1 uVar6;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  ArgsManager *in_stack_fffffffffffffd08;
  allocator<char> *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  ArgsManager *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_1ca;
  allocator<char> local_1c9;
  allocator<char> local_1c8;
  allocator<char> local_1c7;
  allocator<char> local_1c6;
  allocator<char> local_1c5;
  allocator<char> local_1c4;
  allocator<char> local_1c3;
  allocator<char> local_1c2;
  allocator<char> local_1c1 [441];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd28,
             (char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
             in_stack_fffffffffffffd18);
  bVar1 = ArgsManager::IsArgNegated
                    ((ArgsManager *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                     in_stack_fffffffffffffcf8);
  uVar6 = (undefined1)((ulong)in_stack_fffffffffffffcf8 >> 0x38);
  pLVar4 = LogInstance();
  pLVar4->m_print_to_file = !bVar1;
  std::__cxx11::string::~string(in_stack_fffffffffffffcd8);
  std::allocator<char>::~allocator(local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd28,
             (char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
             in_stack_fffffffffffffd18);
  fs::path::path((path *)0xdd1df8,(char *)in_stack_fffffffffffffcd8);
  ArgsManager::GetPathArg
            (in_stack_fffffffffffffd28,
             (string *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
             (path *)in_stack_fffffffffffffd18);
  AbsPathForConfigVal(in_stack_fffffffffffffd08,
                      (path *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                      (bool)uVar6);
  LogInstance();
  fs::path::operator=(in_stack_fffffffffffffce8,
                      (path *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
  uVar6 = (undefined1)((ulong)in_stack_fffffffffffffce8 >> 0x38);
  fs::path::~path((path *)in_stack_fffffffffffffcd8);
  fs::path::~path((path *)in_stack_fffffffffffffcd8);
  fs::path::~path((path *)in_stack_fffffffffffffcd8);
  std::__cxx11::string::~string(in_stack_fffffffffffffcd8);
  std::allocator<char>::~allocator(&local_1c2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd28,
             (char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
             in_stack_fffffffffffffd18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd28,
             (char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
             in_stack_fffffffffffffd18);
  ArgsManager::GetBoolArg
            ((ArgsManager *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
             in_stack_fffffffffffffcd8,(bool)uVar6);
  bVar1 = ArgsManager::GetBoolArg
                    ((ArgsManager *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                     in_stack_fffffffffffffcd8,(bool)uVar6);
  pLVar4 = LogInstance();
  pLVar4->m_print_to_console = bVar1;
  std::__cxx11::string::~string(in_stack_fffffffffffffcd8);
  std::allocator<char>::~allocator(&local_1c4);
  std::__cxx11::string::~string(in_stack_fffffffffffffcd8);
  std::allocator<char>::~allocator(&local_1c3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd28,
             (char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
             in_stack_fffffffffffffd18);
  bVar1 = ArgsManager::GetBoolArg
                    ((ArgsManager *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                     in_stack_fffffffffffffcd8,(bool)uVar6);
  pLVar4 = LogInstance();
  pLVar4->m_log_timestamps = bVar1;
  std::__cxx11::string::~string(in_stack_fffffffffffffcd8);
  std::allocator<char>::~allocator(&local_1c5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd28,
             (char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
             in_stack_fffffffffffffd18);
  bVar1 = ArgsManager::GetBoolArg
                    ((ArgsManager *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                     in_stack_fffffffffffffcd8,(bool)uVar6);
  pLVar4 = LogInstance();
  pLVar4->m_log_time_micros = bVar1;
  std::__cxx11::string::~string(in_stack_fffffffffffffcd8);
  std::allocator<char>::~allocator(&local_1c6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd28,
             (char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
             in_stack_fffffffffffffd18);
  bVar1 = ArgsManager::GetBoolArg
                    ((ArgsManager *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                     in_stack_fffffffffffffcd8,(bool)uVar6);
  pLVar4 = LogInstance();
  pLVar4->m_log_threadnames = bVar1;
  std::__cxx11::string::~string(in_stack_fffffffffffffcd8);
  std::allocator<char>::~allocator(&local_1c7);
  this = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
             in_stack_fffffffffffffd18);
  bVar2 = ArgsManager::GetBoolArg
                    ((ArgsManager *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                     in_stack_fffffffffffffcd8,(bool)uVar6);
  pLVar4 = LogInstance();
  pLVar4->m_log_sourcelocations = (bool)(bVar2 & 1);
  std::__cxx11::string::~string(in_stack_fffffffffffffcd8);
  std::allocator<char>::~allocator(&local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)CONCAT17(bVar2,in_stack_fffffffffffffd20),(allocator<char> *)pLVar4);
  bVar3 = ArgsManager::GetBoolArg
                    ((ArgsManager *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                     in_stack_fffffffffffffcd8,(bool)uVar6);
  pLVar5 = LogInstance();
  pLVar5->m_always_print_category_level = (bool)(bVar3 & 1);
  std::__cxx11::string::~string(in_stack_fffffffffffffcd8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  uVar6 = (undefined1)((ulong)in_RDI >> 0x38);
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)CONCAT17(bVar2,in_stack_fffffffffffffd20),(allocator<char> *)pLVar4);
  fLogIPs = ArgsManager::GetBoolArg
                      ((ArgsManager *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                       in_stack_fffffffffffffcd8,(bool)uVar6);
  std::__cxx11::string::~string(in_stack_fffffffffffffcd8);
  std::allocator<char>::~allocator(&local_1ca);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SetLoggingOptions(const ArgsManager& args)
{
    LogInstance().m_print_to_file = !args.IsArgNegated("-debuglogfile");
    LogInstance().m_file_path = AbsPathForConfigVal(args, args.GetPathArg("-debuglogfile", DEFAULT_DEBUGLOGFILE));
    LogInstance().m_print_to_console = args.GetBoolArg("-printtoconsole", !args.GetBoolArg("-daemon", false));
    LogInstance().m_log_timestamps = args.GetBoolArg("-logtimestamps", DEFAULT_LOGTIMESTAMPS);
    LogInstance().m_log_time_micros = args.GetBoolArg("-logtimemicros", DEFAULT_LOGTIMEMICROS);
    LogInstance().m_log_threadnames = args.GetBoolArg("-logthreadnames", DEFAULT_LOGTHREADNAMES);
    LogInstance().m_log_sourcelocations = args.GetBoolArg("-logsourcelocations", DEFAULT_LOGSOURCELOCATIONS);
    LogInstance().m_always_print_category_level = args.GetBoolArg("-loglevelalways", DEFAULT_LOGLEVELALWAYS);

    fLogIPs = args.GetBoolArg("-logips", DEFAULT_LOGIPS);
}